

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void __thiscall
spirv_cross::SPIRExpression::SPIRExpression
          (SPIRExpression *this,string *expr,TypeID expression_type_,bool immutable_)

{
  bool immutable__local;
  string *expr_local;
  SPIRExpression *this_local;
  TypeID expression_type__local;
  
  IVariant::IVariant(&this->super_IVariant);
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRExpression_005984a0;
  TypedID<(spirv_cross::Types)0>::TypedID
            ((TypedID<(spirv_cross::Types)0> *)&(this->super_IVariant).field_0xc,0);
  ::std::__cxx11::string::string((string *)&this->expression,(string *)expr);
  (this->expression_type).id = expression_type_.id;
  TypedID<(spirv_cross::Types)0>::TypedID(&this->loaded_from,0);
  this->immutable = immutable_;
  this->need_transpose = false;
  this->access_chain = false;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::SmallVector
            (&this->expression_dependencies);
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::SmallVector
            (&this->implied_read_expressions);
  this->emitted_loop_level = 0;
  return;
}

Assistant:

SPIRExpression(std::string expr, TypeID expression_type_, bool immutable_)
	    : expression(move(expr))
	    , expression_type(expression_type_)
	    , immutable(immutable_)
	{
	}